

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisDecoderDecodeOperands
          (ZydisDecoder *decoder,ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count)

{
  byte bVar1;
  ZydisInstructionEncoding ZVar2;
  ZydisBroadcastMode ZVar3;
  ZydisMemoryOperandType ZVar14;
  uint uVar15;
  ushort uVar4;
  short sVar5;
  ushort uVar6;
  ZyanStatus ZVar7;
  ZydisMemoryOperandType ZVar8;
  ZydisRegister ZVar9;
  ZydisOperandType ZVar10;
  ZydisOperandDefinition *pZVar11;
  ulong uVar12;
  byte bVar13;
  ZydisDecodedInstructionRawImmValue_ ZVar16;
  ZydisElementType ZVar17;
  uint uVar18;
  ZyanU8 ZVar19;
  ushort uVar20;
  ZydisRegisterClass ZVar21;
  ZydisInternalElementType element;
  ZyanU8 ZVar22;
  ZydisDecodedOperand *operand;
  long lVar23;
  bool bVar24;
  bool bVar25;
  ulong local_50;
  
  ZVar7 = 0x80100004;
  if ((context != (ZydisDecoderContext *)0x0 && decoder != (ZydisDecoder *)0x0) &&
     (instruction != (ZydisDecodedInstruction *)0x0 &&
      (ZydisInstructionDefinition *)context->definition != (ZydisInstructionDefinition *)0x0)) {
    if ((operand_count < 0xb) &&
       ((operands != (ZydisDecodedOperand *)0x0 || operand_count == '\0' &&
        (ZVar7 = 0x8010000d, (decoder->decoder_mode & 1) == 0)))) {
      uVar15._0_1_ = instruction->operand_count;
      uVar15._1_1_ = instruction->operand_count_visible;
      uVar15._2_2_ = *(undefined2 *)&instruction->field_0x1a;
      uVar18 = (uint)operand_count;
      if ((byte)(undefined1)uVar15 < operand_count) {
        uVar18 = uVar15;
      }
      ZVar7 = 0x100000;
      if ((char)uVar18 != '\0') {
        if (operands == (ZydisDecodedOperand *)0x0) {
          __assert_fail("operands",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x640,
                        "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                       );
        }
        pZVar11 = ZydisGetOperandDefinitions((ZydisInstructionDefinition *)context->definition);
        memset(operands,0,(ulong)((uVar18 & 0xff) << 4) * 5);
        ZVar22 = '\0';
        lVar23 = 0;
        local_50 = 0;
        operand = operands;
        do {
          operand->id = ZVar22;
          operand->visibility =
               *(ushort *)((long)pZVar11->size + lVar23 + -2) >> 6 & ZYDIS_OPERAND_VISIBILITY_HIDDEN
          ;
          operand->actions = *(byte *)((long)pZVar11->size + lVar23 + -1) & 0xf;
          uVar4 = *(ushort *)((long)pZVar11->size + lVar23 + -2) & 0x3f;
          if (uVar4 == 3) {
            operand->type = ZYDIS_OPERAND_TYPE_IMMEDIATE;
            operand->size = 8;
            (operand->field_10).imm.value.u = 1;
            (operand->field_10).ptr.segment = 0;
            goto LAB_001100d3;
          }
          if (uVar4 == 2) {
            operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
            (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MEM;
            switch(*(byte *)((long)pZVar11->size + lVar23 + 7) >> 3 & 0xf) {
            case 0:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
              ZVar19 = (context->reg_info).id_reg;
              break;
            case 1:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
              ZVar19 = (context->reg_info).id_rm;
              break;
            case 2:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
              ZVar19 = '\0';
              break;
            case 3:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
              ZVar19 = '\x02';
              break;
            case 4:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
              ZVar19 = '\x03';
              break;
            case 5:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
              ZVar19 = '\x06';
              break;
            case 6:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
              ZVar19 = '\a';
              break;
            case 7:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)decoder->stack_width * 4);
              ZVar19 = '\x04';
              break;
            case 8:
              ZVar21 = *(ZydisRegisterClass *)
                        (ZydisDecodeOperandImplicitMemory_lookup + (ulong)decoder->stack_width * 4);
              ZVar19 = '\x05';
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x62c,
                            "void ZydisDecodeOperandImplicitMemory(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            ZVar9 = ZydisRegisterEncode(ZVar21,ZVar19);
            (operand->field_10).mem.base = ZVar9;
            bVar13 = *(byte *)((long)pZVar11->size + lVar23 + 7) & 7;
            if (bVar13 != 0) {
              ZVar9 = ZydisRegisterEncode(ZYDIS_REGCLASS_SEGMENT,bVar13 - 1);
              (operand->field_10).mem.segment = ZVar9;
              if (ZVar9 == ZYDIS_REGISTER_NONE) {
                __assert_fail("operand->mem.segment",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x633,
                              "void ZydisDecodeOperandImplicitMemory(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                             );
              }
            }
            goto LAB_001100d3;
          }
          if (uVar4 != 1) goto LAB_001100d3;
          operand->type = ZYDIS_OPERAND_TYPE_REGISTER;
          switch(*(byte *)((long)pZVar11->size + lVar23 + 7) & 7) {
          case 0:
            ZVar8 = *(ushort *)((long)pZVar11->size + lVar23 + 8) & 0x1ff;
            break;
          case 1:
            ZVar21 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->eosz_index * 4);
            goto LAB_0010ffa4;
          case 2:
            bVar25 = instruction->address_width != ' ';
            bVar24 = instruction->address_width == '\x10';
            goto LAB_0010ff9c;
          case 3:
            ZVar8 = instruction->address_width == ' ' ^ 0xc5;
            bVar25 = instruction->address_width == '\x10';
            ZVar14 = 0xc3;
            goto LAB_0010ffd4;
          case 4:
            ZVar8 = 0xc5 - (decoder->stack_width < ZYDIS_STACK_WIDTH_64);
            break;
          case 5:
            bVar25 = decoder->stack_width != ZYDIS_STACK_WIDTH_32;
            bVar24 = decoder->stack_width == ZYDIS_STACK_WIDTH_16;
LAB_0010ff9c:
            ZVar21 = bVar25 + ZYDIS_REGCLASS_GPR32;
            if (bVar24) {
              ZVar21 = ZYDIS_REGCLASS_GPR16;
            }
LAB_0010ffa4:
            ZVar8 = ZydisRegisterEncode(ZVar21,*(byte *)((long)pZVar11->size + lVar23 + 8) & 0x3f);
            break;
          case 6:
            ZVar8 = (decoder->stack_width != ZYDIS_STACK_WIDTH_32) + 0xc1;
            bVar25 = decoder->stack_width == ZYDIS_STACK_WIDTH_16;
            ZVar14 = 0xc0;
LAB_0010ffd4:
            if (bVar25) {
              ZVar8 = ZVar14;
            }
            break;
          case 7:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x5e9,
                          "void ZydisDecodeOperandImplicitRegister(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          (operand->field_10).mem.type = ZVar8;
LAB_001100d3:
          ZVar10 = operand->type;
          if (ZVar10 != ZYDIS_OPERAND_TYPE_UNUSED) goto LAB_00110482;
          operand->encoding =
               *(byte *)((long)pZVar11->size + lVar23 + 7) &
               (ZYDIS_OPERAND_ENCODING_JIMM16_32_64|ZYDIS_OPERAND_ENCODING_JIMM64);
          switch(*(ushort *)((long)pZVar11->size + lVar23 + -2) & 0x3f) {
          case 4:
            ZVar21 = ZYDIS_REGCLASS_GPR8;
            break;
          case 5:
            ZVar21 = ZYDIS_REGCLASS_GPR16;
            break;
          case 6:
            ZVar21 = ZYDIS_REGCLASS_GPR32;
            break;
          case 7:
            ZVar21 = ZYDIS_REGCLASS_GPR64;
            break;
          case 8:
            bVar13 = instruction->operand_width;
            if ((0x30 < bVar13 - 0x10) ||
               ((0x1000000010001U >> ((ulong)(bVar13 - 0x10) & 0x3f) & 1) == 0)) {
              __assert_fail("(instruction->operand_width == 16) || (instruction->operand_width == 32) || (instruction->operand_width == 64)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x685,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            goto LAB_00110314;
          case 9:
            uVar15 = instruction->operand_width - 0x10;
            if ((0x30 < uVar15) || ((0x1000000010001U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) {
              __assert_fail("(instruction->operand_width == 16) || (instruction->operand_width == 32) || (instruction->operand_width == 64)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x68c,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            ZVar21 = ZYDIS_REGCLASS_GPR64 - ((instruction->operand_width - 0x10 & 0xef) == 0);
            break;
          case 10:
            uVar15 = instruction->operand_width - 0x10;
            if ((0x30 < uVar15) || ((0x1000000010001U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) {
              __assert_fail("(instruction->operand_width == 16) || (instruction->operand_width == 32) || (instruction->operand_width == 64)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x693,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            ZVar21 = instruction->operand_width == 0x10 ^ ZYDIS_REGCLASS_GPR32;
            break;
          case 0xb:
            bVar13 = instruction->address_width;
            if ((0x30 < bVar13 - 0x10) ||
               ((0x1000000010001U >> ((ulong)(bVar13 - 0x10) & 0x3f) & 1) == 0)) {
              __assert_fail("(instruction->address_width == 16) || (instruction->address_width == 32) || (instruction->address_width == 64)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x699,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
LAB_00110314:
            ZVar21 = ZYDIS_REGCLASS_GPR16;
            if (bVar13 != 0x10) {
              ZVar21 = (bVar13 != 0x20) + ZYDIS_REGCLASS_GPR32;
            }
            break;
          case 0xc:
            ZVar21 = ZYDIS_REGCLASS_REQUIRED_BITS;
            break;
          case 0xd:
            ZVar21 = ZYDIS_REGCLASS_MMX;
            break;
          case 0xe:
            ZVar21 = ZYDIS_REGCLASS_XMM;
            break;
          case 0xf:
            ZVar21 = ZYDIS_REGCLASS_YMM;
            break;
          case 0x10:
            ZVar21 = ZYDIS_REGCLASS_ZMM;
            break;
          case 0x11:
            ZVar21 = ZYDIS_REGCLASS_TMM;
            break;
          case 0x12:
            ZVar21 = ZYDIS_REGCLASS_BOUND;
            break;
          case 0x13:
            ZVar21 = ZYDIS_REGCLASS_SEGMENT;
            break;
          case 0x14:
            ZVar21 = ZYDIS_REGCLASS_CONTROL;
            break;
          case 0x15:
            ZVar21 = ZYDIS_REGCLASS_DEBUG;
            break;
          case 0x16:
            ZVar21 = ZYDIS_REGCLASS_MASK;
            break;
          case 0x17:
            ZydisDecodeOperandMemory(context,instruction,operand,ZYDIS_REGCLASS_INVALID);
            goto switchD_0011010f_caseD_1b;
          case 0x18:
            ZVar21 = ZYDIS_REGCLASS_XMM;
            goto LAB_0011041c;
          case 0x19:
            ZVar21 = ZYDIS_REGCLASS_YMM;
            goto LAB_0011041c;
          case 0x1a:
            ZVar21 = ZYDIS_REGCLASS_ZMM;
LAB_0011041c:
            ZydisDecodeOperandMemory(context,instruction,operand,ZVar21);
            (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MAX_VALUE;
          default:
            goto switchD_0011010f_caseD_1b;
          case 0x1d:
            ZVar19 = (instruction->raw).imm[0].size;
            if ((ZVar19 != '\x10') && (ZVar19 != ' ')) {
              __assert_fail("(instruction->raw.imm[0].size == 16) || (instruction->raw.imm[0].size == 32)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x718,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            if ((instruction->raw).imm[1].size != '\x10') {
              __assert_fail("instruction->raw.imm[1].size == 16",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x719,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            operand->type = ZYDIS_OPERAND_TYPE_POINTER;
            (operand->field_10).mem.segment = *(ZydisRegister *)&(instruction->raw).imm[0].value;
            (operand->field_10).ptr.segment = *(ZyanU16 *)&(instruction->raw).imm[1].value;
            goto switchD_0011010f_caseD_1b;
          case 0x1e:
            operand->actions = '\0';
            ZydisDecodeOperandMemory(context,instruction,operand,ZYDIS_REGCLASS_INVALID);
            (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_AGEN;
            goto switchD_0011010f_caseD_1b;
          case 0x1f:
            if ((instruction->raw).disp.size == '\0') {
              __assert_fail("instruction->raw.disp.size",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x726,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
            (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MEM;
            *(ZyanU8 *)((long)&operand->field_10 + 0x21) = (instruction->raw).disp.size;
            *(ZyanU8 *)((long)&operand->field_10 + 0x20) = (instruction->raw).disp.offset;
            (operand->field_10).mem.disp.value = (instruction->raw).disp.value;
            goto switchD_0011010f_caseD_1b;
          case 0x20:
            operand->actions = '\0';
            ZydisDecodeOperandMemory(context,instruction,operand,ZYDIS_REGCLASS_INVALID);
            (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MIB;
switchD_0011010f_caseD_1b:
            if (operand->type != ZYDIS_OPERAND_TYPE_UNUSED) {
              if (((instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
                   ZYDIS_INSTRUCTION_ENCODING_EVEX) && ((instruction->raw).disp.size == '\b')) {
                (operand->field_10).mem.disp.value =
                     (ulong)context->cd8_scale * (operand->field_10).mem.disp.value;
              }
              goto LAB_0011047e;
            }
            uVar4 = *(ushort *)((long)pZVar11->size + lVar23 + -2) & 0x3f;
            if (uVar4 != 0x1b) {
              if (uVar4 != 0x1c) {
                __assert_fail("operands[i].type == ZYDIS_OPERAND_TYPE_IMMEDIATE",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x763,
                              "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                             );
              }
              if ((instruction->raw).imm[local_50].is_relative == '\0') {
                __assert_fail("instruction->raw.imm[imm_id].is_relative",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x74a,
                              "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                             );
              }
            }
            if (1 < (byte)local_50) {
              __assert_fail("(imm_id == 0) || (imm_id == 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x74d,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            operand->type = ZYDIS_OPERAND_TYPE_IMMEDIATE;
            operand->size =
                 *(short *)((long)pZVar11->size + (ulong)context->eosz_index * 2 + lVar23) << 3;
            if ((*(byte *)((long)pZVar11->size + lVar23 + 7) & 0x3f) == 5) {
              if ((instruction->raw).imm[local_50].size != '\b') {
                __assert_fail("instruction->raw.imm[imm_id].size == 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x753,
                              "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                             );
              }
              ZVar16._0_4_ = (uint)(instruction->raw).imm[local_50].value.u & 0xf;
              ZVar16.u._4_4_ = 0;
            }
            else {
              ZVar16 = (instruction->raw).imm[local_50].value;
            }
            *(ZydisDecodedInstructionRawImmValue_ *)((long)&operand->field_10 + 8) = ZVar16;
            (operand->field_10).mem.scale = (instruction->raw).imm[0].offset;
            (operand->field_10).imm.size = (instruction->raw).imm[0].size;
            (operand->field_10).imm.is_signed = (instruction->raw).imm[local_50].is_signed;
            (operand->field_10).imm.is_relative = (instruction->raw).imm[local_50].is_relative;
            local_50 = (ulong)(byte)((byte)local_50 + 1);
            goto switchD_0011049b_caseD_4;
          }
          switch(*(byte *)((long)pZVar11->size + lVar23 + 7) & 0x3f) {
          case 1:
            bVar13 = (context->reg_info).id_reg;
            break;
          case 2:
            bVar13 = (context->reg_info).id_rm;
            break;
          case 3:
            bVar13 = ZydisCalcRegisterId(context,instruction,ZYDIS_REG_ENCODING_OPCODE,ZVar21);
            break;
          case 4:
            bVar13 = (context->reg_info).id_ndsndd;
            break;
          case 5:
            bVar1 = *(byte *)&(instruction->raw).imm[0].value;
            bVar13 = bVar1 >> 4;
            if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
              if ((ZVar21 - ZYDIS_REGCLASS_XMM < 3) &&
                 ((instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
                  ZYDIS_INSTRUCTION_ENCODING_EVEX)) {
                bVar13 = bVar13 | bVar1 * '\x02' & 0x10;
              }
            }
            else {
              bVar13 = bVar13 & 7;
            }
            break;
          case 6:
            bVar13 = (context->vector_unified).mask;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x6f1,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          ZydisDecodeOperandRegister(instruction,operand,ZVar21,bVar13);
          if ((*(byte *)((long)pZVar11->size + lVar23 + 10) & 1) != 0) {
            operand->attributes = operand->attributes | 1;
          }
LAB_0011047e:
          ZVar10 = operand->type;
LAB_00110482:
          switch(ZVar10) {
          case ZYDIS_OPERAND_TYPE_REGISTER:
            sVar5 = *(short *)((long)pZVar11->size + lVar23 + (ulong)context->eosz_index * 2);
            if (sVar5 == 0) {
              uVar4 = ZydisRegisterGetWidth(instruction->machine_mode,(operand->field_10).mem.type);
            }
            else {
              uVar4 = sVar5 << 3;
            }
            operand->size = uVar4;
            operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
            operand->element_size = uVar4;
            goto LAB_00110682;
          case ZYDIS_OPERAND_TYPE_MEMORY:
            if ((*(byte *)((long)pZVar11->size + lVar23 + 10) & 2) == 0) {
              uVar12 = instruction->attributes;
              if ((uVar12 >> 0x25 & 1) == 0) {
                if ((uVar12 >> 0x26 & 1) != 0) goto LAB_0011053c;
                if ((uVar12 >> 0x27 & 1) != 0) goto LAB_00110712;
                if ((uVar12 >> 0x28 & 1) == 0) {
                  if ((uVar12 >> 0x29 & 1) == 0) {
                    if ((uVar12 >> 0x2a & 1) == 0) goto LAB_0011050f;
                    (operand->field_10).mem.segment = ZYDIS_REGISTER_GS;
                  }
                  else {
                    (operand->field_10).mem.segment = ZYDIS_REGISTER_FS;
                  }
                }
                else {
                  (operand->field_10).mem.segment = ZYDIS_REGISTER_ES;
                }
              }
              else {
                (operand->field_10).mem.segment = ZYDIS_REGISTER_CS;
              }
            }
            else {
LAB_0011050f:
              if ((operand->field_10).mem.segment == ZYDIS_REGISTER_NONE) {
                uVar12 = (ulong)(operand->field_10).mem.base;
                if ((uVar12 < 0x3b) && ((0x600060006000000U >> (uVar12 & 0x3f) & 1) != 0)) {
LAB_0011053c:
                  (operand->field_10).mem.segment = ZYDIS_REGISTER_SS;
                }
                else {
LAB_00110712:
                  (operand->field_10).mem.segment = ZYDIS_REGISTER_DS;
                }
              }
            }
            ZVar2 = instruction->encoding;
            if (ZVar2 < ZYDIS_INSTRUCTION_ENCODING_EVEX) {
              sVar5 = *(short *)((long)pZVar11->size + lVar23 + (ulong)context->eosz_index * 2);
              if ((operand->field_10).mem.type != ZYDIS_MEMOP_TYPE_AGEN) {
                if ((sVar5 == 0) && ((instruction->meta).category != ZYDIS_CATEGORY_AMX_TILE)) {
                  __assert_fail("definition->size[context->eosz_index] || (instruction->meta.category == ZYDIS_CATEGORY_AMX_TILE)"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x3ec,
                                "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                               );
                }
                goto LAB_0011067a;
              }
              if (sVar5 != 0) {
                __assert_fail("definition->size[context->eosz_index] == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x3e6,
                              "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                             );
              }
              uVar4 = (ushort)instruction->address_width;
              operand->size = (ushort)instruction->address_width;
              operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
              goto LAB_00110682;
            }
            if (ZVar2 == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
              sVar5 = *(short *)((long)pZVar11->size + lVar23 + (ulong)context->eosz_index * 2);
              if (sVar5 != 0) {
                uVar4 = sVar5 << 3;
LAB_0011085d:
                operand->size = uVar4;
                if (uVar4 == 0) {
                  __assert_fail("operand->size",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x41e,
                                "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                               );
                }
                goto LAB_00110682;
              }
              uVar20 = (instruction->avx).vector_length;
              if (uVar20 == 0) {
                __assert_fail("instruction->avx.vector_length",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x3fa,
                              "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                             );
              }
              bVar13 = (context->evex).element_size;
              uVar4 = (ushort)bVar13;
              if (bVar13 == 0) {
                __assert_fail("context->evex.element_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x3fb,
                              "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                             );
              }
              ZVar19 = (context->evex).tuple_type;
              if (ZVar19 != '\x10') {
                if (ZVar19 == '\x02') {
                  if ((instruction->avx).broadcast.mode == ZYDIS_BROADCAST_MODE_INVALID) {
                    uVar4 = uVar20 >> 1;
                    goto LAB_0011085d;
                  }
                  goto LAB_0011067d;
                }
                if (ZVar19 != '\x01') {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x41b,
                                "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                               );
                }
                if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID)
                goto LAB_0011067d;
                goto LAB_0011095e;
              }
              if ((instruction->avx).broadcast.mode == ZYDIS_BROADCAST_MODE_INVALID) {
                uVar4 = uVar20 >> 2;
                goto LAB_0011085d;
              }
              goto LAB_0011067d;
            }
            if (ZVar2 != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x48f,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            sVar5 = *(short *)((long)pZVar11->size + lVar23 + (ulong)context->eosz_index * 2);
            if (sVar5 != 0) goto LAB_0011067a;
            if ((*(byte *)((long)pZVar11->size + lVar23 + 6) & 0x1f) != 1) {
              __assert_fail("definition->element_type == ZYDIS_IELEMENT_TYPE_VARIABLE",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x42b,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            if ((instruction->avx).vector_length != 0x200) {
              __assert_fail("instruction->avx.vector_length == 512",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x42c,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            break;
          case ZYDIS_OPERAND_TYPE_POINTER:
            bVar13 = (instruction->raw).imm[0].size;
            if ((bVar13 != 0x10) && (bVar13 != 0x20)) {
              __assert_fail("(instruction->raw.imm[0].size == 16) || (instruction->raw.imm[0].size == 32)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x494,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            if ((instruction->raw).imm[1].size != '\x10') {
              __assert_fail("instruction->raw.imm[1].size == 16",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x495,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            uVar4 = bVar13 + 0x10;
            goto LAB_0011067d;
          case ZYDIS_OPERAND_TYPE_IMMEDIATE:
switchD_0011049b_caseD_4:
            sVar5 = *(short *)((long)pZVar11->size + lVar23 + (ulong)context->eosz_index * 2);
LAB_0011067a:
            uVar4 = sVar5 << 3;
            goto LAB_0011067d;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x49c,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          switch((instruction->avx).conversion.mode) {
          case ZYDIS_CONVERSION_MODE_INVALID:
            operand->size = 0x200;
            uVar20 = 0x20;
            ZVar17 = ZYDIS_ELEMENT_TYPE_FLOAT32;
            uVar4 = 0x200;
            switch((context->mvex).functionality) {
            case '\n':
            case '\f':
            case '\x12':
            case '\x16':
              break;
            case '\v':
              operand->size = 0x100;
              ZVar17 = ZYDIS_ELEMENT_TYPE_FLOAT32;
              goto LAB_00110933;
            case '\r':
            case '\x13':
            case '\x17':
              uVar20 = 0x40;
              ZVar17 = ZYDIS_ELEMENT_TYPE_FLOAT64;
              break;
            case '\x0f':
              operand->size = 0x100;
              goto LAB_001108e2;
            case '\x11':
            case '\x15':
            case '\x19':
              uVar20 = 0x40;
            case '\x0e':
            case '\x10':
            case '\x14':
            case '\x18':
              ZVar17 = ZYDIS_ELEMENT_TYPE_INT;
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x459,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            goto switchD_00110816_caseD_a;
          case ZYDIS_CONVERSION_MODE_FLOAT16:
            operand->size = 0x100;
            uVar20 = 0x10;
            ZVar17 = ZYDIS_ELEMENT_TYPE_FLOAT16;
            break;
          case ZYDIS_CONVERSION_MODE_SINT8:
            operand->size = 0x80;
            ZVar17 = ZYDIS_ELEMENT_TYPE_INT;
            goto LAB_0011090b;
          case ZYDIS_CONVERSION_MODE_REQUIRED_BITS:
            operand->size = 0x80;
            ZVar17 = ZYDIS_ELEMENT_TYPE_UINT;
LAB_0011090b:
            uVar20 = 8;
            uVar4 = 0x80;
            goto switchD_00110816_caseD_a;
          case ZYDIS_CONVERSION_MODE_SINT16:
            operand->size = 0x100;
            uVar20 = 0x10;
LAB_001108e2:
            ZVar17 = ZYDIS_ELEMENT_TYPE_INT;
            break;
          case ZYDIS_CONVERSION_MODE_MAX_VALUE:
            operand->size = 0x100;
            uVar20 = 0x10;
            ZVar17 = ZYDIS_ELEMENT_TYPE_UINT;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x476,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
LAB_00110933:
          uVar4 = 0x100;
switchD_00110816_caseD_a:
          operand->element_type = ZVar17;
          operand->element_size = uVar20;
          ZVar3 = (instruction->avx).broadcast.mode;
          if (ZVar3 - ZYDIS_BROADCAST_MODE_1_TO_8 < 2) {
LAB_0011095e:
            uVar4 = uVar20;
            operand->size = uVar4;
          }
          else if (ZVar3 - ZYDIS_BROADCAST_MODE_4_TO_8 < 2) {
            uVar4 = uVar20 << 2;
LAB_0011067d:
            operand->size = uVar4;
          }
          else if (ZVar3 != ZYDIS_BROADCAST_MODE_INVALID) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x487,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
LAB_00110682:
          element = *(byte *)((long)pZVar11->size + lVar23 + 6) &
                    (ZYDIS_IELEMENT_TYPE_CC5|ZYDIS_IELEMENT_TYPE_INT);
          if ((byte)element < 2) {
            uVar20 = operand->element_size;
LAB_001106d0:
            if (uVar20 != 0) goto LAB_001106d5;
            uVar6 = 1;
          }
          else {
            ZydisGetElementInfo(element,&operand->element_type,&operand->element_size);
            uVar4 = operand->size;
            uVar20 = operand->element_size;
            if (uVar20 == 0) {
              operand->element_size = uVar4;
              uVar20 = uVar4;
              goto LAB_001106d0;
            }
LAB_001106d5:
            uVar6 = 1;
            if ((uVar4 != 0) && (operand->element_type != ZYDIS_ELEMENT_TYPE_CC)) {
              uVar6 = uVar4 / uVar20;
            }
          }
          operand->element_count = uVar6;
          lVar23 = lVar23 + 0xd;
          ZVar22 = ZVar22 + '\x01';
          operand = operand + 1;
        } while ((ulong)(uVar18 & 0xff) * 0xd != lVar23);
        ZVar7 = 0x100000;
        if ((instruction->avx).mask.mode == ZYDIS_MASK_MODE_MERGING) {
          if (operands->actions == '\x03') {
            bVar13 = 9;
          }
          else {
            if (operands->actions != '\x02') {
              return 0x100000;
            }
            bVar13 = operands->type == ZYDIS_OPERAND_TYPE_MEMORY ^ 9;
          }
          operands->actions = bVar13;
        }
      }
    }
  }
  return ZVar7;
}

Assistant:

ZyanStatus ZydisDecoderDecodeOperands(const ZydisDecoder* decoder,
    const ZydisDecoderContext* context, const ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand* operands, ZyanU8 operand_count)
{
#ifdef ZYDIS_MINIMAL_MODE

    ZYAN_UNUSED(decoder);
    ZYAN_UNUSED(context);
    ZYAN_UNUSED(instruction);
    ZYAN_UNUSED(operands);
    ZYAN_UNUSED(operand_count);

    return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code

#else

    if (!decoder || !context || !context->definition || !instruction ||
        (operand_count && !operands) || (operand_count > ZYDIS_MAX_OPERAND_COUNT))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL))
    {
        return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code
    }

    operand_count = ZYAN_MIN(operand_count, instruction->operand_count);
    if (!operand_count)
    {
        return ZYAN_STATUS_SUCCESS;
    }

    return ZydisDecodeOperands(decoder, context, instruction, operands, operand_count);

#endif
}